

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DTDScanner::scanAttValue
          (DTDScanner *this,XMLCh *attrName,XMLBuffer *toFill,AttTypes type)

{
  ulong uVar1;
  bool bVar2;
  EntityExpRes EVar3;
  UnexpectedEOFException *this_00;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLReader *pXVar6;
  EndOfEntityException *anon_var_0;
  XMLCh tmpBuf [9];
  bool local_43;
  byte local_42;
  byte local_41;
  int local_40;
  XMLCh XStack_3c;
  bool escaped;
  bool gotLeadingSurrogate;
  bool firstNonWS;
  States curState;
  XMLCh secondCh;
  XMLCh nextCh;
  XMLSize_t curReader;
  XMLCh quoteCh;
  XMLBuffer *pXStack_28;
  AttTypes type_local;
  XMLBuffer *toFill_local;
  XMLCh *attrName_local;
  DTDScanner *this_local;
  
  curReader._4_4_ = type;
  pXStack_28 = toFill;
  toFill_local = (XMLBuffer *)attrName;
  attrName_local = (XMLCh *)this;
  XMLBuffer::reset(toFill);
  bVar2 = ReaderMgr::skipIfQuote(this->fReaderMgr,(XMLCh *)((long)&curReader + 2));
  if (!bVar2) {
    return false;
  }
  _curState = ReaderMgr::getCurrentReaderNum(this->fReaderMgr);
  XStack_3c = L'\0';
  local_40 = 1;
  local_41 = 0;
  local_42 = 0;
LAB_003f3f31:
  do {
    _gotLeadingSurrogate = ReaderMgr::getNextChar(this->fReaderMgr);
    XVar5 = _curState;
    if (_gotLeadingSurrogate == L'\0') {
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
                 ,0x313,Gen_UnexpectedEOF,this->fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,
                  UnexpectedEOFException::~UnexpectedEOFException);
    }
    if (_gotLeadingSurrogate == curReader._2_2_) {
      XVar4 = ReaderMgr::getCurrentReaderNum(this->fReaderMgr);
      uVar1 = _curState;
      if (XVar5 == XVar4) {
        return true;
      }
      XVar5 = ReaderMgr::getCurrentReaderNum(this->fReaderMgr);
      if (XVar5 < uVar1) {
        XMLScanner::emitError(this->fScanner,PartialMarkupInEntity);
        return false;
      }
    }
    local_43 = false;
    if (_gotLeadingSurrogate == L'&') {
      EVar3 = scanEntityRef(this,(XMLCh *)&gotLeadingSurrogate,&stack0xffffffffffffffc4,&local_43);
      if (EVar3 != EntityExp_Returned) {
        local_42 = 0;
        goto LAB_003f3f31;
      }
    }
    else if (((ushort)_gotLeadingSurrogate < 0xd800) || (0xdbff < (ushort)_gotLeadingSurrogate)) {
      if ((local_42 & 1) == 0) {
        pXVar6 = ReaderMgr::getCurrentReader(this->fReaderMgr);
        bVar2 = XMLReader::isXMLChar(pXVar6,_gotLeadingSurrogate);
        if (!bVar2) {
          XMLString::binToText
                    ((uint)(ushort)_gotLeadingSurrogate,(XMLCh *)&anon_var_0,8,0x10,
                     this->fMemoryManager);
          XMLScanner::emitError
                    (this->fScanner,InvalidCharacterInAttrValue,(XMLCh *)toFill_local,
                     (XMLCh *)&anon_var_0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else if (((ushort)_gotLeadingSurrogate < 0xdc00) || (0xdfff < (ushort)_gotLeadingSurrogate)) {
        XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
      }
      local_42 = 0;
    }
    else if ((local_42 & 1) == 0) {
      local_42 = 1;
    }
    else {
      XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
    }
    if (((local_43 & 1U) == 0) && (_gotLeadingSurrogate == L'<')) {
      XMLScanner::emitError
                (this->fScanner,BracketInAttrValue,(XMLCh *)toFill_local,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    if (curReader._4_4_ == AttTypes_Min) {
      if (((local_43 & 1U) == 0) &&
         (((_gotLeadingSurrogate == L'\t' || (_gotLeadingSurrogate == L'\n')) ||
          (_gotLeadingSurrogate == L'\r')))) {
        _gotLeadingSurrogate = L' ';
      }
LAB_003f4301:
      XMLBuffer::append(pXStack_28,_gotLeadingSurrogate);
      if (XStack_3c != L'\0') {
        XMLBuffer::append(pXStack_28,XStack_3c);
        XStack_3c = L'\0';
      }
    }
    else if (local_40 == 0) {
      pXVar6 = ReaderMgr::getCurrentReader(this->fReaderMgr);
      bVar2 = XMLReader::isWhitespace(pXVar6,_gotLeadingSurrogate);
      if (!bVar2) {
        if ((local_41 & 1) != 0) {
          XMLBuffer::append(pXStack_28,L' ');
        }
        local_40 = 1;
        local_41 = 1;
        goto LAB_003f4301;
      }
    }
    else {
      if (local_40 != 1) goto LAB_003f4301;
      pXVar6 = ReaderMgr::getCurrentReader(this->fReaderMgr);
      bVar2 = XMLReader::isWhitespace(pXVar6,_gotLeadingSurrogate);
      if (!bVar2) {
        local_41 = 1;
        goto LAB_003f4301;
      }
      local_40 = 0;
    }
  } while( true );
}

Assistant:

bool DTDScanner::scanAttValue(const   XMLCh* const        attrName
                                ,       XMLBuffer&          toFill
                                , const XMLAttDef::AttTypes type)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

    //
    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    //
    const XMLSize_t curReader = fReaderMgr->getCurrentReaderNum();

    //
    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    //
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr->getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr->getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr->getCurrentReaderNum())
                {
                    fScanner->emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //
            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            //
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Check for correct surrogate pairs
                if (gotLeadingSurrogate)
                    fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
             else
            {
                if (gotLeadingSurrogate)
                {
                    if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
                        fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                }
                // Its got to at least be a valid XML character
                else if (!fReaderMgr->getCurrentReader()->isXMLChar(nextCh))
                {
                    XMLCh tmpBuf[9];
                    XMLString::binToText
                    (
                        nextCh
                        , tmpBuf
                        , 8
                        , 16
                        , fMemoryManager
                    );
                    fScanner->emitError
                    (
                        XMLErrs::InvalidCharacterInAttrValue
                        , attrName
                        , tmpBuf
                    );
                }

                gotLeadingSurrogate = false;
            }

            //
            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            //
            if (!escaped && (nextCh == chOpenAngle))
                fScanner->emitError(XMLErrs::BracketInAttrValue, attrName);

            //
            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of
            //  leading and trailing whitespace.
            //
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                        nextCh = chSpace;
                }
            }
             else
            {
                if (curState == InWhitespace)
                {
                    if (!fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                     else
                    {
                        continue;
                    }
                }
                 else if (curState == InContent)
                {
                    if (fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        curState = InWhitespace;
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }

    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}